

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

void __thiscall position::undo_move(position *this,Move *m)

{
  byte bVar1;
  Color CVar2;
  U64 UVar3;
  Color *pCVar4;
  Color *pCVar5;
  long lVar6;
  Color *pCVar7;
  info *piVar8;
  info *ifo;
  byte bVar9;
  Square rt;
  Color us;
  Square to;
  Square from;
  Piece cp;
  Piece p;
  Square rf;
  Color local_50;
  Color local_4c;
  Color local_48;
  Color local_44 [3];
  Color local_38;
  Color local_34;
  
  bVar9 = 0;
  local_44[0] = (Color)m->t;
  local_48 = (Color)m->f;
  bVar1 = m->type;
  local_38 = (this->pcs).piece_on._M_elems[m->t];
  CVar2 = (this->ifo).stm;
  local_4c = CVar2 ^ black;
  ifo = &this->ifo;
  local_44[2] = (this->ifo).captured;
  if (bVar1 == 0xc) {
    piece_data::do_quiet(&this->pcs,&local_4c,&local_38,local_44,&local_48,ifo);
    local_50 = (this->ifo).stm;
    pCVar7 = &local_50;
    local_34 = (local_44[0] + (uint)(local_4c != white) * 0x10) - 8;
    pCVar5 = &local_34;
    pCVar4 = local_44 + 2;
  }
  else if (bVar1 == 0xb) {
    pCVar5 = local_44;
    piece_data::do_quiet(&this->pcs,&local_4c,&local_38,pCVar5,&local_48,ifo);
    local_50 = (this->ifo).stm;
    pCVar7 = &local_50;
    pCVar4 = local_44 + 2;
  }
  else {
    if (bVar1 == 10) {
      pCVar7 = &local_38;
      pCVar4 = local_44;
      pCVar5 = &local_48;
LAB_001210b3:
      piece_data::do_quiet(&this->pcs,&local_4c,pCVar7,pCVar4,pCVar5,ifo);
      goto LAB_00121217;
    }
    local_50 = local_38;
    if (bVar1 < 4) {
      piece_data::remove_piece(&this->pcs,&local_4c,&local_50,local_44,ifo);
    }
    else {
      if (7 < bVar1) {
        if (bVar1 == 9) {
          local_50 = 0x3b;
          if (CVar2 == black) {
            local_50 = no_color;
          }
          local_34 = 0x38;
          if (CVar2 == black) {
            local_34 = white;
          }
          pCVar5 = &local_34;
          local_44[1] = 5;
          piece_data::do_quiet(&this->pcs,&local_4c,local_44 + 1,local_44,&local_48,ifo);
          local_44[1] = 3;
          pCVar7 = local_44 + 1;
          pCVar4 = &local_50;
        }
        else {
          if (bVar1 != 8) goto LAB_00121217;
          local_50 = 0x3f;
          if (CVar2 == black) {
            local_50 = 7;
          }
          local_34 = 0x3d;
          if (CVar2 == black) {
            local_34 = 5;
          }
          pCVar4 = &local_34;
          local_44[1] = 5;
          piece_data::do_quiet(&this->pcs,&local_4c,local_44 + 1,local_44,&local_48,ifo);
          local_44[1] = 3;
          pCVar7 = local_44 + 1;
          pCVar5 = &local_50;
        }
        goto LAB_001210b3;
      }
      piece_data::remove_piece(&this->pcs,&local_4c,&local_50,local_44,ifo);
      local_50 = (this->ifo).stm;
      piece_data::add_piece(&this->pcs,&local_50,local_44 + 2,local_44,ifo);
    }
    pCVar7 = &local_4c;
    local_50 = white;
    pCVar4 = &local_50;
    pCVar5 = &local_48;
  }
  piece_data::add_piece(&this->pcs,pCVar7,pCVar4,pCVar5,ifo);
LAB_00121217:
  UVar3 = this->hidx;
  this->hidx = UVar3 - 1;
  piVar8 = this->history + (UVar3 - 1);
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    ifo->checkers = piVar8->checkers;
    piVar8 = (info *)((long)piVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    ifo = (info *)((long)ifo + (ulong)bVar9 * -0x10 + 8);
  }
  return;
}

Assistant:

void position::undo_move(const Move& m) {
	const Square from = Square(m.t);
	const Square to = Square(m.f);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = Color(to_move() ^ 1);
	Piece cp = ifo.captured;

	if (t == quiet) pcs.do_quiet(us, p, from, to, ifo);

	else if (t == capture) {
		pcs.do_quiet(us, p, from, to, ifo);
		pcs.add_piece(to_move(), cp, from, ifo);
	}

	else if (t == ep) {
		pcs.do_quiet(us, p, from, to, ifo);
		pcs.add_piece(to_move(), cp, Square(from + (us == white ? -8 : 8)), ifo);
	}

	else if (t < capture_promotion_q) {
		pcs.remove_piece(us, piece_on(from), from, ifo);
		pcs.add_piece(us, pawn, to, ifo);
	}

	else if (t < castle_ks) {
		pcs.remove_piece(us, piece_on(from), from, ifo);
		pcs.add_piece(to_move(), cp, from, ifo);
		pcs.add_piece(us, pawn, to, ifo);
	}

	else if (t == castle_ks) {
		Square rt = (us == white ? H1 : H8);
		Square rf = (us == white ? F1 : F8);
		pcs.do_quiet(us, king, from, to, ifo);
		pcs.do_quiet(us, rook, rf, rt, ifo);
	}

	else if (t == castle_qs) {
		Square rf = (us == white ? D1 : D8);
		Square rt = (us == white ? A1 : A8);
		pcs.do_quiet(us, king, from, to, ifo);
		pcs.do_quiet(us, rook, rf, rt, ifo);
	}
	ifo = history[--hidx];
}